

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_DCL(Context *ctx)

{
  uint32 uVar1;
  uint32 index;
  uint32 usage;
  char index_str [16];
  char *usage_str;
  DestArgInfo *arg;
  char dst [64];
  Context *ctx_local;
  
  make_D3D_destarg_string(ctx,(char *)&arg,0x40);
  index_str._8_8_ = (long)"\n\nUSAGE: %s <profile> [dir1] ... [dirN]\n\n" + 0x29;
  memset(&index,0,0x10);
  if ((ctx->dest_arg).regtype == REG_TYPE_SAMPLER) {
    uVar1 = ctx->dwords[0];
    if (uVar1 == 2) {
      index_str._8_8_ = anon_var_dwarf_511e;
    }
    else if (uVar1 == 3) {
      index_str._8_8_ = anon_var_dwarf_512a;
    }
    else {
      if (uVar1 != 4) {
        fail(ctx,"unknown sampler texture type");
        return;
      }
      index_str._8_8_ = anon_var_dwarf_5136;
    }
  }
  else if ((ctx->dest_arg).regtype == REG_TYPE_MISCTYPE) {
    if (1 < (uint)(ctx->dest_arg).regnum) {
      fail(ctx,"unknown misc register type");
      return;
    }
    index_str._8_8_ = (long)"\n\nUSAGE: %s <profile> [dir1] ... [dirN]\n\n" + 0x29;
  }
  else {
    index_str._8_8_ = usagestrs[ctx->dwords[0]];
    if (ctx->dwords[1] != 0) {
      snprintf((char *)&index,0x10,"%u",(ulong)ctx->dwords[1]);
    }
  }
  output_line(ctx,"dcl%s%s%s",index_str._8_8_,&index,&arg);
  return;
}

Assistant:

static void emit_D3D_DCL(Context *ctx)
{
    char dst[64];
    make_D3D_destarg_string(ctx, dst, sizeof (dst));
    const DestArgInfo *arg = &ctx->dest_arg;
    const char *usage_str = "";
    char index_str[16] = { '\0' };

    if (arg->regtype == REG_TYPE_SAMPLER)
    {
        switch ((const TextureType) ctx->dwords[0])
        {
            case TEXTURE_TYPE_2D: usage_str = "_2d"; break;
            case TEXTURE_TYPE_CUBE: usage_str = "_cube"; break;
            case TEXTURE_TYPE_VOLUME: usage_str = "_volume"; break;
            default: fail(ctx, "unknown sampler texture type"); return;
        } // switch
    } // if

    else if (arg->regtype == REG_TYPE_MISCTYPE)
    {
        switch ((const MiscTypeType) arg->regnum)
        {
            case MISCTYPE_TYPE_POSITION:
            case MISCTYPE_TYPE_FACE:
                usage_str = "";  // just become "dcl vFace" or whatever.
                break;
            default: fail(ctx, "unknown misc register type"); return;
        } // switch
    } // else if

    else
    {
        const uint32 usage = ctx->dwords[0];
        const uint32 index = ctx->dwords[1];
        usage_str = usagestrs[usage];
        if (index != 0)
            snprintf(index_str, sizeof (index_str), "%u", (uint) index);
    } // else

    output_line(ctx, "dcl%s%s%s", usage_str, index_str, dst);
}